

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

shared_ptr<helics::Core> helics::CoreFactory::makeCore(CoreType type,string_view name)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  shared_ptr<helics::CoreFactory::CoreBuilder> *psVar3;
  HelicsException *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int code;
  undefined4 in_register_0000003c;
  element_type *peVar5;
  string_view message;
  shared_ptr<helics::Core> sVar6;
  
  peVar5 = (element_type *)CONCAT44(in_register_0000003c,type);
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_str;
  code = (int)name._M_len;
  if (code == 0) {
    psVar3 = MasterCoreBuilder::getIndexedBuilder(0);
  }
  else {
    if (code == 0x4d) {
      peVar5->_vptr_Core = emptyCore;
      pp_Var2 = DAT_00575c00;
      peVar5[1]._vptr_Core = DAT_00575c00;
      if (pp_Var2 != (_func_int **)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
          UNLOCK();
        }
        else {
          *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
        }
      }
      goto LAB_002d02c3;
    }
    if (code == 0x42) {
      this = (HelicsException *)__cxa_allocate_exception(0x28);
      message._M_str = "nullcore is explicitly not available nor will ever be";
      message._M_len = 0x35;
      HelicsException::HelicsException(this,message);
      __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
    }
    psVar3 = MasterCoreBuilder::getBuilder(code);
  }
  peVar1 = (psVar3->super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  (**peVar1->_vptr_CoreBuilder)(peVar5,peVar1,_Var4._M_pi);
  _Var4._M_pi = extraout_RDX;
LAB_002d02c3:
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  return (shared_ptr<helics::Core>)
         sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> makeCore(CoreType type, std::string_view name)
{
    if (type == CoreType::NULLCORE) {
        throw(HelicsException("nullcore is explicitly not available nor will ever be"));
    }
    if (type == CoreType::DEFAULT) {
        return MasterCoreBuilder::getIndexedBuilder(0)->build(name);
    }
    if (type == CoreType::EMPTY) {
        return emptyCore;
    }
    return MasterCoreBuilder::getBuilder(static_cast<int>(type))->build(name);
}